

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O3

void update_address(MemoryDescr *rmd,MemoryDescr *dmd,unsigned_long addbytes)

{
  long lVar1;
  char *pcVar2;
  
  if (current_ls == (LinkedSection *)0x0) {
    pcVar2 = "default";
  }
  else {
    pcVar2 = current_ls->name;
  }
  lVar1 = rmd->current + addbytes;
  rmd->current = lVar1;
  if (rmd->len + rmd->org < lVar1) {
    error(0x3f,rmd->name,pcVar2);
  }
  if (dmd != rmd) {
    lVar1 = addbytes + dmd->current;
    dmd->current = lVar1;
    if (dmd->len + dmd->org < lVar1) {
      error(0x3f,dmd->name,pcVar2,lVar1);
      return;
    }
  }
  return;
}

Assistant:

void update_address(struct MemoryDescr *rmd,struct MemoryDescr *dmd,
                    unsigned long addbytes)
{
  const char *secname = current_ls ? current_ls->name : defmemname;

  rmd->current += (lword)addbytes;
  if (rmd->current > rmd->org + rmd->len) {
    /* Fatal: Size of memory region exceeded! */
    error(63,rmd->name,secname,rmd->current);
  }
  if (dmd != rmd) {
    dmd->current += addbytes;
    if (dmd->current > dmd->org + dmd->len) {
      /* Fatal: Size of memory region exceeded! */
      error(63,dmd->name,secname,dmd->current);
    }
  }
}